

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O0

int GifPickChangedPixels(uint8_t *lastFrame,uint8_t *frame,int numPixels)

{
  int ii;
  uint8_t *writeIter;
  int numChanged;
  int numPixels_local;
  uint8_t *frame_local;
  uint8_t *lastFrame_local;
  
  numChanged = 0;
  writeIter = frame;
  frame_local = frame;
  lastFrame_local = lastFrame;
  for (ii = 0; ii < numPixels; ii = ii + 1) {
    if (((*lastFrame_local != *frame_local) || (lastFrame_local[1] != frame_local[1])) ||
       (lastFrame_local[2] != frame_local[2])) {
      *writeIter = *frame_local;
      writeIter[1] = frame_local[1];
      writeIter[2] = frame_local[2];
      numChanged = numChanged + 1;
      writeIter = writeIter + 4;
    }
    lastFrame_local = lastFrame_local + 4;
    frame_local = frame_local + 4;
  }
  return numChanged;
}

Assistant:

int GifPickChangedPixels( const uint8_t* lastFrame, uint8_t* frame, int numPixels )
{
    int numChanged = 0;
    uint8_t* writeIter = frame;

    for (int ii=0; ii<numPixels; ++ii)
    {
        if(lastFrame[0] != frame[0] ||
           lastFrame[1] != frame[1] ||
           lastFrame[2] != frame[2])
        {
            writeIter[0] = frame[0];
            writeIter[1] = frame[1];
            writeIter[2] = frame[2];
            ++numChanged;
            writeIter += 4;
        }
        lastFrame += 4;
        frame += 4;
    }

    return numChanged;
}